

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O0

ssize_t __thiscall FileManager::write(FileManager *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined7 extraout_var;
  element_type *peVar4;
  undefined7 extraout_var_00;
  undefined4 extraout_var_01;
  undefined7 uVar5;
  undefined4 in_register_00000034;
  size_t length_local;
  void *data_local;
  FileManager *this_local;
  
  bVar1 = checkActiveFile(this);
  if (bVar1) {
    peVar4 = std::__shared_ptr_access<AssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<AssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->activeFile);
    uVar2 = (*peVar4->_vptr_AssemblerFile[4])();
    if ((uVar2 & 1) == 0) {
      Logger::queueError<>(Error,"No file opened");
      this_local._7_1_ = 0;
      uVar5 = extraout_var_00;
    }
    else {
      peVar4 = std::__shared_ptr_access<AssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<AssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->activeFile);
      iVar3 = (*peVar4->_vptr_AssemblerFile[5])(peVar4,CONCAT44(in_register_00000034,__fd),__buf);
      uVar5 = (undefined7)(CONCAT44(extraout_var_01,iVar3) >> 8);
      this_local._7_1_ = (byte)iVar3 & 1;
    }
  }
  else {
    this_local._7_1_ = 0;
    uVar5 = extraout_var;
  }
  return CONCAT71(uVar5,this_local._7_1_);
}

Assistant:

bool FileManager::write(void* data, size_t length)
{
	if (!checkActiveFile())
		return false;

	if (!activeFile->isOpen())
	{
		Logger::queueError(Logger::Error, "No file opened");
		return false;
	}

	return activeFile->write(data,length);
}